

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoRcc.cxx
# Opt level: O1

string * __thiscall
cmQtAutoRcc::MultiConfigOutput_abi_cxx11_(string *__return_storage_ptr__,cmQtAutoRcc *this)

{
  int iVar1;
  string local_38;
  
  if (MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_);
    if (iVar1 != 0) {
      MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_._M_dataplus._M_p =
           (pointer)&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_,"_CMAKE_","");
      __cxa_atexit(std::__cxx11::string::~string,&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->RccPathChecksum_)._M_dataplus._M_p);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  cmQtAutoGen::AppendFilenameSuffix
            (&local_38,&this->RccFileName_,&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoRcc::MultiConfigOutput() const
{
  static std::string const suffix = "_CMAKE_";
  std::string res;
  res += RccPathChecksum_;
  res += '/';
  res += AppendFilenameSuffix(RccFileName_, suffix);
  return res;
}